

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O3

void event_end_of_breakfast(tgestate_t *state)

{
  uint8_t *puVar1;
  byte bVar2;
  long lVar3;
  
  state->bell = '(';
  if (state->hero_in_breakfast != '\0') {
    state->vischars[0].mi.mappos.u = 0x34;
    state->vischars[0].mi.mappos.v = 0x3e;
    state->hero_in_breakfast = '\0';
  }
  if (state->in_solitary == '\0') {
    puVar1 = &state->vischars[0].flags;
    *puVar1 = *puVar1 & 0xbf;
    state->vischars[0].route.index = 0x90;
    state->vischars[0].route.step = '\x03';
    set_route(state,state->vischars);
  }
  state->character_structs[0x14].room = '\x19';
  state->character_structs[0x15].room = '\x19';
  state->character_structs[0x16].room = '\x19';
  state->character_structs[0x17].room = '\x17';
  state->character_structs[0x18].room = '\x17';
  state->character_structs[0x19].room = '\x17';
  bVar2 = 0x90;
  lVar3 = 0;
  do {
    set_character_route(state,"\f\r\x14\x15\x16\x0e\x0f\x17\x18\x19"[lVar3],(route_t)(bVar2 + 0x300)
                       );
    bVar2 = bVar2 + ((char)lVar3 == '\x04');
    lVar3 = lVar3 + 1;
  } while ((char)lVar3 != '\n');
  set_roomdef(state,'\x17',0x25,0xd);
  set_roomdef(state,'\x17',0x28,0xd);
  set_roomdef(state,'\x17',0x2b,0xd);
  set_roomdef(state,'\x19',0x1d,0xd);
  set_roomdef(state,'\x19',0x20,0xd);
  set_roomdef(state,'\x19',0x23,0xd);
  set_roomdef(state,'\x19',0x26,0xd);
  if ((byte)(state->room_index - 1) < 0x1c) {
    setup_room(state);
    plot_interior_tiles(state);
    return;
  }
  return;
}

Assistant:

static void event_end_of_breakfast(tgestate_t *state)
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;
  end_of_breakfast(state);
}